

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O3

void CreateBackwardReferencesH9
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,H9 *hasher,int *dist_cache,size_t *last_insert_len,
               Command *commands,size_t *num_commands,size_t *num_literals)

{
  ulong uVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  ushort uVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  uint32_t uVar9;
  ulong uVar10;
  long lVar11;
  int *piVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ushort uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  size_t sVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  uint16_t uVar27;
  size_t sVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  char *pcVar36;
  byte bVar37;
  ulong uVar38;
  ulong uVar39;
  bool bVar40;
  size_t local_138;
  ulong local_130;
  ulong local_128;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  Command *local_e0;
  ulong local_d0;
  ulong local_c0;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_88;
  
  uVar4 = (position - 3) + num_bytes;
  sVar28 = position;
  if (3 < num_bytes) {
    sVar28 = uVar4;
  }
  lVar25 = 0x200;
  if (params->quality < 9) {
    lVar25 = 0x40;
  }
  local_138 = *last_insert_len;
  uVar1 = position + num_bytes;
  local_e0 = commands;
  if (uVar1 <= position + 4) {
LAB_001097ff:
    *last_insert_len = (local_138 + uVar1) - position;
    *num_commands = *num_commands + ((long)local_e0 - (long)commands >> 4);
    return;
  }
  uVar34 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  local_f8 = lVar25 + position;
  lVar3 = position - 1;
  sVar20 = position;
LAB_001086d7:
  local_b0 = uVar1 - sVar20;
  uVar14 = uVar34;
  if (sVar20 < uVar34) {
    uVar14 = sVar20;
  }
  uVar30 = sVar20 & ringbuffer_mask;
  piVar2 = (int *)(ringbuffer + uVar30);
  uVar21 = (ulong)((uint)local_b0 & 7);
  uVar10 = local_b0 & 0xfffffffffffffff8;
  local_110 = 0x1f90;
  bVar40 = false;
  uVar15 = 0;
  uVar22 = 0;
  local_100 = 0;
  local_c0 = 0;
  do {
    uVar29 = (long)kDistanceCacheOffset[uVar22] + (long)dist_cache[kDistanceCacheIndex[uVar22]];
    if (((uVar29 <= uVar14) && (sVar20 - uVar29 < sVar20)) && (uVar15 + uVar30 <= ringbuffer_mask))
    {
      uVar39 = sVar20 - uVar29 & ringbuffer_mask;
      if ((uVar39 + uVar15 <= ringbuffer_mask) &&
         (ringbuffer[uVar15 + uVar30] == ringbuffer[uVar39 + uVar15])) {
        if (7 < local_b0) {
          lVar11 = 0;
          uVar18 = 0;
LAB_001087a8:
          if (*(ulong *)(piVar2 + uVar18 * 2) == *(ulong *)(ringbuffer + uVar18 * 8 + uVar39))
          goto code_r0x001087ba;
          uVar18 = *(ulong *)(ringbuffer + uVar18 * 8 + uVar39) ^ *(ulong *)(piVar2 + uVar18 * 2);
          uVar39 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
            }
          }
          uVar18 = (uVar39 >> 3 & 0x1fffffff) - lVar11;
          goto LAB_001087fb;
        }
        piVar12 = piVar2;
        uVar33 = 0;
LAB_0010884d:
        uVar18 = uVar33;
        if (uVar21 != 0) {
          uVar19 = uVar21 | uVar33;
          uVar38 = uVar21;
          do {
            uVar18 = uVar33;
            if (ringbuffer[uVar33 + uVar39] != (uint8_t)*piVar12) break;
            piVar12 = (int *)((long)piVar12 + 1);
            uVar33 = uVar33 + 1;
            uVar38 = uVar38 - 1;
            uVar18 = uVar19;
          } while (uVar38 != 0);
        }
LAB_001087fb:
        if (((2 < uVar18) || ((uVar22 < 2 && (uVar18 == 2)))) &&
           (uVar39 = uVar18 * 0x21c + kDistanceShortCodeCost[uVar22], local_110 < uVar39)) {
          bVar40 = true;
          uVar15 = uVar18;
          local_110 = uVar39;
          local_100 = uVar18;
          local_c0 = uVar29;
        }
      }
    }
    uVar22 = uVar22 + 1;
  } while (uVar22 != 0x10);
  uVar32 = (uint)(*piVar2 * 0x1e35a7bd) >> 0x11;
  lVar11 = (ulong)(uVar32 << 10) + 0x10000;
  uVar5 = hasher->num_[uVar32];
  uVar22 = (ulong)(uVar5 - 0x100);
  if (uVar5 < 0x101) {
    uVar22 = 0;
  }
  uVar29 = (ulong)uVar5;
  while (uVar22 < uVar29) {
    uVar29 = uVar29 - 1;
    uVar24 = *(uint *)((long)hasher->buckets_ + (uVar29 & 0xff) * 4 + lVar11 + -0x10000);
    uVar39 = sVar20 - uVar24;
    if (uVar14 < uVar39) break;
    if (uVar15 + uVar30 <= ringbuffer_mask) {
      uVar18 = (ulong)(uVar24 & (uint)ringbuffer_mask);
      if ((uVar18 + uVar15 <= ringbuffer_mask) &&
         (ringbuffer[uVar15 + uVar30] == ringbuffer[uVar18 + uVar15])) {
        if (7 < local_b0) {
          lVar13 = 0;
          uVar33 = 0;
LAB_0010893d:
          if (*(ulong *)(piVar2 + uVar33 * 2) == *(ulong *)(ringbuffer + uVar33 * 8 + uVar18))
          goto code_r0x00108950;
          uVar33 = *(ulong *)(ringbuffer + uVar33 * 8 + uVar18) ^ *(ulong *)(piVar2 + uVar33 * 2);
          uVar18 = 0;
          if (uVar33 != 0) {
            for (; (uVar33 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
            }
          }
          uVar33 = (uVar18 >> 3 & 0x1fffffff) - lVar13;
          goto LAB_0010897f;
        }
        piVar12 = piVar2;
        uVar38 = 0;
LAB_001089d3:
        uVar33 = uVar38;
        if (uVar21 != 0) {
          uVar35 = uVar21 | uVar38;
          uVar19 = uVar21;
          do {
            uVar33 = uVar38;
            if (ringbuffer[uVar38 + uVar18] != (uint8_t)*piVar12) break;
            piVar12 = (int *)((long)piVar12 + 1);
            uVar38 = uVar38 + 1;
            uVar19 = uVar19 - 1;
            uVar33 = uVar35;
          } while (uVar19 != 0);
        }
LAB_0010897f:
        if (3 < uVar33) {
          iVar23 = 0x1f;
          if ((uint)uVar39 != 0) {
            for (; (uint)uVar39 >> iVar23 == 0; iVar23 = iVar23 + -1) {
            }
          }
          uVar18 = (ulong)(iVar23 * -0x78 + 0x1e00) + uVar33 * 0x21c;
          if (local_110 < uVar18) {
            bVar40 = true;
            uVar15 = uVar33;
            local_110 = uVar18;
            local_100 = uVar33;
            local_c0 = uVar39;
          }
        }
      }
    }
  }
  *(int *)((long)hasher->buckets_ + ((ulong)uVar5 & 0xff) * 4 + lVar11 + -0x10000) = (int)sVar20;
  hasher->num_[uVar32] = uVar5 + 1;
  if (bVar40) {
    local_130 = 0;
LAB_00108a40:
    uVar14 = local_138 + 4;
    uVar15 = (lVar3 + num_bytes) - sVar20;
    iVar23 = 0;
    local_88 = local_130;
LAB_00108a72:
    local_b0 = local_b0 - 1;
    uVar10 = local_100 - 1;
    if (local_b0 <= local_100 - 1) {
      uVar10 = local_b0;
    }
    if (4 < params->quality) {
      uVar10 = 0;
    }
    uVar21 = sVar20 + 1;
    uVar22 = uVar34;
    if (uVar21 < uVar34) {
      uVar22 = uVar21;
    }
    uVar29 = uVar21 & ringbuffer_mask;
    piVar2 = (int *)(ringbuffer + uVar29);
    uVar39 = (ulong)((uint)local_b0 & 7);
    uVar30 = 0x1f90;
    bVar40 = false;
    uVar18 = 0;
    local_130 = 0;
    local_f8 = 0;
LAB_00108afc:
    uVar33 = (long)kDistanceCacheOffset[uVar18] + (long)dist_cache[kDistanceCacheIndex[uVar18]];
    if (((uVar33 <= uVar22) && (uVar21 - uVar33 < uVar21)) && (uVar10 + uVar29 <= ringbuffer_mask))
    {
      uVar38 = uVar21 - uVar33 & ringbuffer_mask;
      if ((ringbuffer_mask < uVar38 + uVar10) ||
         (ringbuffer[uVar10 + uVar29] != ringbuffer[uVar38 + uVar10])) goto LAB_00108c05;
      uVar19 = uVar39;
      if (7 < local_b0) {
        lVar11 = 0;
        uVar35 = 0;
LAB_00108b70:
        if (*(ulong *)(piVar2 + uVar35 * 2) == *(ulong *)(ringbuffer + uVar35 * 8 + uVar38))
        goto code_r0x00108b82;
        uVar19 = *(ulong *)(ringbuffer + uVar35 * 8 + uVar38) ^ *(ulong *)(piVar2 + uVar35 * 2);
        uVar38 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
          }
        }
        uVar35 = (uVar38 >> 3 & 0x1fffffff) - lVar11;
        goto LAB_00108bb8;
      }
      uVar35 = 0;
      piVar12 = piVar2;
      goto joined_r0x00108c24;
    }
    goto LAB_00108c05;
  }
  uVar15 = (hasher->dict_search_stats_).num_lookups;
  uVar10 = (hasher->dict_search_stats_).num_matches;
  if (uVar15 >> 7 <= uVar10) {
    uVar22 = (ulong)(uVar32 & 0xfffffffe);
    bVar8 = true;
    local_130 = 0;
    bVar40 = bVar8;
    local_108 = local_c0;
    local_128 = local_110;
    uVar21 = local_100;
LAB_0010913f:
    uVar5 = kStaticDictionaryHash[uVar22];
    uVar15 = uVar15 + 1;
    (hasher->dict_search_stats_).num_lookups = uVar15;
    if ((ulong)uVar5 != 0) {
      uVar30 = (ulong)(uVar5 & 0x1f);
      if (local_b0 < uVar30) goto LAB_0010925f;
      pcVar36 = &kBrotliDictionary +
                uVar30 * (uVar5 >> 5) +
                (ulong)*(uint *)(&kBrotliDictionaryOffsetsByLength + uVar30 * 4);
      if (7 < uVar30) {
        uVar29 = (ulong)(uVar5 & 0x18);
        lVar11 = 0;
        uVar39 = 0;
LAB_001091b0:
        if (*(ulong *)(pcVar36 + uVar39 * 8) == *(ulong *)(piVar2 + uVar39 * 2))
        goto code_r0x001091c2;
        uVar39 = *(ulong *)(piVar2 + uVar39 * 2) ^ *(ulong *)(pcVar36 + uVar39 * 8);
        uVar29 = 0;
        if (uVar39 != 0) {
          for (; (uVar39 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
          }
        }
        local_100 = (uVar29 >> 3 & 0x1fffffff) - lVar11;
        goto LAB_0010920e;
      }
      uVar29 = 0;
      goto LAB_0010927c;
    }
    goto LAB_0010925f;
  }
LAB_00109344:
  local_138 = local_138 + 1;
  position = sVar20 + 1;
  if (local_f8 < position) {
    if ((uint)((int)lVar25 * 4) + local_f8 < position) {
      uVar14 = sVar20 + 0x11;
      if (uVar1 - 4 <= sVar20 + 0x11) {
        uVar14 = uVar1 - 4;
      }
      for (; position < uVar14; position = position + 4) {
        uVar32 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
        uVar27 = hasher->num_[uVar32];
        *(int *)((long)hasher->buckets_ + (ulong)(uVar32 * 0x400 + (uint)(byte)uVar27 * 4)) =
             (int)position;
        hasher->num_[uVar32] = uVar27 + 1;
        local_138 = local_138 + 4;
      }
    }
    else {
      uVar14 = sVar20 + 9;
      if (uVar4 <= sVar20 + 9) {
        uVar14 = uVar4;
      }
      for (; position < uVar14; position = position + 2) {
        uVar32 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
        uVar27 = hasher->num_[uVar32];
        *(int *)((long)hasher->buckets_ + (ulong)(uVar32 * 0x400 + (uint)(byte)uVar27 * 4)) =
             (int)position;
        hasher->num_[uVar32] = uVar27 + 1;
        local_138 = local_138 + 2;
      }
    }
  }
  goto LAB_0010979e;
code_r0x001087ba:
  uVar18 = uVar18 + 1;
  lVar11 = lVar11 + -8;
  piVar12 = (int *)(uVar10 + (long)piVar2);
  uVar33 = uVar10;
  if (local_b0 >> 3 == uVar18) goto LAB_0010884d;
  goto LAB_001087a8;
code_r0x00108950:
  uVar33 = uVar33 + 1;
  lVar13 = lVar13 + -8;
  piVar12 = (int *)(uVar10 + (long)piVar2);
  uVar38 = uVar10;
  if (local_b0 >> 3 == uVar33) goto LAB_001089d3;
  goto LAB_0010893d;
code_r0x001091c2:
  uVar39 = uVar39 + 1;
  lVar11 = lVar11 + -8;
  if ((uVar5 & 0x1f) >> 3 == uVar39) goto code_r0x001091ce;
  goto LAB_001091b0;
code_r0x001091ce:
  pcVar36 = pcVar36 + -lVar11;
LAB_0010927c:
  uVar39 = (ulong)uVar5 & 7;
  local_100 = uVar29;
  if ((uVar5 & 7) != 0) {
    uVar18 = uVar29 | uVar39;
    do {
      local_100 = uVar29;
      if (*(char *)((long)piVar2 + uVar29) != *pcVar36) break;
      pcVar36 = pcVar36 + 1;
      uVar29 = uVar29 + 1;
      uVar39 = uVar39 - 1;
      local_100 = uVar18;
    } while (uVar39 != 0);
  }
LAB_0010920e:
  if ((local_100 != 0) && (uVar30 < local_100 + 10)) {
    local_c0 = (ulong)(uVar5 >> 5) + uVar14 + 1 +
               ((ulong)""[uVar30 - local_100] <<
               ((&kBrotliDictionarySizeBitsByLength)[uVar30] & 0x3f));
    iVar23 = 0x1f;
    if ((uint)local_c0 != 0) {
      for (; (uint)local_c0 >> iVar23 == 0; iVar23 = iVar23 + -1) {
      }
    }
    local_110 = (local_100 * 0x21c - (ulong)(uint)(iVar23 * 0x78)) + 0x1e00;
    if (local_128 <= local_110) {
      local_130 = uVar30 ^ local_100;
      uVar10 = uVar10 + 1;
      (hasher->dict_search_stats_).num_matches = uVar10;
      uVar22 = uVar22 + 1;
      bVar8 = false;
      bVar7 = !bVar40;
      bVar40 = bVar8;
      local_108 = local_c0;
      local_128 = local_110;
      uVar21 = local_100;
      if (bVar7) goto LAB_00108a40;
      goto LAB_0010913f;
    }
  }
LAB_0010925f:
  uVar22 = uVar22 + 1;
  bVar7 = !bVar40;
  bVar40 = false;
  if (bVar7) {
    local_110 = local_128;
    local_c0 = local_108;
    local_100 = uVar21;
    if (bVar8) goto LAB_00109344;
    goto LAB_00108a40;
  }
  goto LAB_0010913f;
code_r0x00108b82:
  uVar35 = uVar35 + 1;
  lVar11 = lVar11 + -8;
  if (uVar15 >> 3 == uVar35) goto code_r0x00108b90;
  goto LAB_00108b70;
code_r0x00108b90:
  uVar35 = -lVar11;
  piVar12 = (int *)((long)piVar2 - lVar11);
joined_r0x00108c24:
  for (; (uVar19 != 0 && (ringbuffer[uVar35 + uVar38] == (uint8_t)*piVar12)); uVar35 = uVar35 + 1) {
    uVar19 = uVar19 - 1;
    piVar12 = (int *)((long)piVar12 + 1);
  }
LAB_00108bb8:
  if (((2 < uVar35) || ((uVar18 < 2 && (uVar35 == 2)))) &&
     (uVar38 = uVar35 * 0x21c + kDistanceShortCodeCost[uVar18], uVar30 < uVar38)) {
    bVar40 = true;
    uVar10 = uVar35;
    uVar30 = uVar38;
    local_130 = uVar35;
    local_f8 = uVar33;
  }
LAB_00108c05:
  uVar18 = uVar18 + 1;
  if (uVar18 == 0x10) goto LAB_00108c3f;
  goto LAB_00108afc;
LAB_00108c3f:
  uVar32 = (uint)(*piVar2 * 0x1e35a7bd) >> 0x11;
  lVar11 = (ulong)(uVar32 << 10) + 0x10000;
  uVar5 = hasher->num_[uVar32];
  uVar33 = (ulong)uVar5;
  uVar18 = (ulong)(uVar5 - 0x100);
  if (uVar5 < 0x101) {
    uVar18 = 0;
  }
  uVar38 = uVar33;
  if (uVar18 < uVar33) {
LAB_00108c8e:
    uVar38 = uVar38 - 1;
    uVar24 = *(uint *)((long)hasher->buckets_ + (uVar38 & 0xff) * 4 + lVar11 + -0x10000);
    uVar19 = uVar21 - uVar24;
    if (uVar19 <= uVar22) {
      if (uVar10 + uVar29 <= ringbuffer_mask) {
        uVar35 = (ulong)(uVar24 & (uint)ringbuffer_mask);
        if ((ringbuffer_mask < uVar10 + uVar35) ||
           (ringbuffer[uVar10 + uVar29] != ringbuffer[uVar10 + uVar35])) goto LAB_00108d83;
        uVar26 = uVar39;
        if (7 < local_b0) {
          lVar13 = 0;
          uVar31 = 0;
LAB_00108cf1:
          if (*(ulong *)(piVar2 + uVar31 * 2) == *(ulong *)(ringbuffer + uVar31 * 8 + uVar35))
          goto code_r0x00108d04;
          uVar26 = *(ulong *)(ringbuffer + uVar31 * 8 + uVar35) ^ *(ulong *)(piVar2 + uVar31 * 2);
          uVar35 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
            }
          }
          uVar31 = (uVar35 >> 3 & 0x1fffffff) - lVar13;
          goto LAB_00108d43;
        }
        uVar31 = 0;
        piVar12 = piVar2;
        goto LAB_00108d9e;
      }
      goto LAB_00108d83;
    }
  }
LAB_00108dd7:
  *(int *)((long)hasher->buckets_ + (uVar33 & 0xff) * 4 + lVar11 + -0x10000) = (int)uVar21;
  hasher->num_[uVar32] = uVar5 + 1;
  uVar10 = sVar20;
  uVar29 = local_138;
  if (bVar40) {
    local_d0 = 0;
    uVar39 = local_f8;
LAB_00109056:
    if ((uVar30 < local_110 + 700) ||
       (uVar10 = uVar21, local_c0 = uVar39, local_100 = local_130, local_88 = local_d0,
       uVar29 = uVar14, iVar23 == 3)) goto LAB_00109431;
    local_138 = local_138 + 1;
    iVar23 = iVar23 + 1;
    uVar22 = sVar20 + 5;
    uVar15 = uVar15 - 1;
    sVar20 = uVar21;
    uVar29 = local_138;
    local_110 = uVar30;
    if (uVar1 <= uVar22) goto LAB_00109431;
    goto LAB_00108a72;
  }
  uVar18 = (hasher->dict_search_stats_).num_lookups;
  local_a8 = (hasher->dict_search_stats_).num_matches;
  if (uVar18 >> 7 <= local_a8) {
    uVar33 = (ulong)(uVar32 & 0xfffffffe);
    bVar40 = true;
    local_108 = local_130;
    local_d0 = 0;
    local_a0 = local_f8;
    local_f8 = uVar30;
    bVar8 = bVar40;
LAB_00108e77:
    uVar5 = kStaticDictionaryHash[uVar33];
    uVar18 = uVar18 + 1;
    (hasher->dict_search_stats_).num_lookups = uVar18;
    if ((ulong)uVar5 != 0) {
      uVar38 = (ulong)(uVar5 & 0x1f);
      if (local_b0 < uVar38) goto LAB_00108f85;
      pcVar36 = &kBrotliDictionary +
                uVar38 * (uVar5 >> 5) +
                (ulong)*(uint *)(&kBrotliDictionaryOffsetsByLength + uVar38 * 4);
      if (7 < uVar38) {
        uVar39 = (ulong)(uVar5 & 0x18);
        lVar11 = 0;
        uVar30 = 0;
LAB_00108ede:
        if (*(ulong *)(pcVar36 + uVar30 * 8) == *(ulong *)(piVar2 + uVar30 * 2))
        goto code_r0x00108ef1;
        uVar39 = *(ulong *)(piVar2 + uVar30 * 2) ^ *(ulong *)(pcVar36 + uVar30 * 8);
        uVar30 = 0;
        if (uVar39 != 0) {
          for (; (uVar39 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
          }
        }
        local_130 = (uVar30 >> 3 & 0x1fffffff) - lVar11;
        goto LAB_00108f30;
      }
      uVar39 = 0;
      goto LAB_00108f9f;
    }
    goto LAB_00108f85;
  }
LAB_00109431:
  local_138 = uVar29;
  uVar14 = uVar34;
  if (uVar10 < uVar34) {
    uVar14 = uVar10;
  }
  uVar9 = (uint32_t)local_138;
  if (uVar14 < local_c0) {
LAB_00109451:
    uVar15 = local_c0 + 0xf;
LAB_00109455:
    if ((local_c0 <= uVar14) && (uVar15 != 0)) {
      dist_cache[3] = dist_cache[2];
      *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
      *dist_cache = (int)local_c0;
    }
    local_e0->insert_len_ = uVar9;
    local_e0->copy_len_ = (uint)local_100 | (int)local_88 << 0x18;
    if (0xf < uVar15) {
      uVar32 = 0x1f;
      uVar24 = (uint)(uVar15 - 0xc);
      if (uVar24 != 0) {
        for (; uVar24 >> uVar32 == 0; uVar32 = uVar32 - 1) {
        }
      }
      uVar17 = (uVar32 ^ 0xffffffe0) + 0x1f;
      bVar40 = (uVar15 - 0xc >> ((ulong)uVar17 & 0x3f) & 1) != 0;
      uVar27 = (ushort)bVar40 + (short)(uVar32 ^ 0xffffffe0) * 2 + 0x4c;
      local_e0->dist_prefix_ = uVar27;
      uVar32 = uVar24 - (bVar40 + 2 << ((byte)uVar17 & 0x3f)) | uVar17 * 0x1000000;
      goto LAB_0010952b;
    }
  }
  else {
    if (local_c0 != (long)*dist_cache) {
      uVar15 = 1;
      if (local_c0 != (long)dist_cache[1]) {
        uVar15 = (local_c0 + 3) - (long)*dist_cache;
        if (uVar15 < 7) {
          bVar37 = (byte)((int)uVar15 << 2);
          uVar32 = 0x9750468;
        }
        else {
          uVar15 = (local_c0 + 3) - (long)dist_cache[1];
          if (6 < uVar15) {
            uVar15 = 2;
            if ((local_c0 != (long)dist_cache[2]) && (uVar15 = 3, local_c0 != (long)dist_cache[3]))
            goto LAB_00109451;
            goto LAB_00109455;
          }
          bVar37 = (byte)((int)uVar15 << 2);
          uVar32 = 0xfdb1ace;
        }
        uVar15 = (ulong)(uVar32 >> (bVar37 & 0x1f) & 0xf);
      }
      goto LAB_00109455;
    }
    local_e0->insert_len_ = uVar9;
    local_e0->copy_len_ = (uint)local_100 | (int)local_88 << 0x18;
    uVar15 = 0;
  }
  uVar27 = (uint16_t)uVar15;
  local_e0->dist_prefix_ = uVar27;
  uVar32 = 0;
LAB_0010952b:
  local_88 = local_88 ^ local_100;
  local_e0->dist_extra_ = uVar32;
  if (local_138 < 6) {
    uVar14 = local_138 & 0xffffffff;
  }
  else if (local_138 < 0x82) {
    uVar32 = 0x1f;
    uVar24 = (uint)(local_138 - 2);
    if (uVar24 != 0) {
      for (; uVar24 >> uVar32 == 0; uVar32 = uVar32 - 1) {
      }
    }
    uVar14 = (ulong)((int)(local_138 - 2 >> ((char)(uVar32 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar32 ^ 0xffffffe0) * 2 + 0x40);
  }
  else if (local_138 < 0x842) {
    uVar32 = 0x1f;
    if (uVar9 - 0x42 != 0) {
      for (; uVar9 - 0x42 >> uVar32 == 0; uVar32 = uVar32 - 1) {
      }
    }
    uVar14 = (ulong)((uVar32 ^ 0xffe0) + 0x2a);
  }
  else {
    uVar14 = 0x15;
    if (0x1841 < local_138) {
      uVar14 = (ulong)(ushort)(0x17 - (local_138 < 0x5842));
    }
  }
  if (local_88 < 10) {
    uVar32 = (int)local_88 - 2;
  }
  else if (local_88 < 0x86) {
    uVar32 = 0x1f;
    uVar24 = (uint)(local_88 - 6);
    if (uVar24 != 0) {
      for (; uVar24 >> uVar32 == 0; uVar32 = uVar32 - 1) {
      }
    }
    uVar32 = (int)(local_88 - 6 >> ((char)(uVar32 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
             (uVar32 ^ 0xffffffe0) * 2 + 0x42;
  }
  else {
    uVar32 = 0x17;
    if (local_88 < 0x846) {
      uVar24 = (int)local_88 - 0x46;
      uVar32 = 0x1f;
      if (uVar24 != 0) {
        for (; uVar24 >> uVar32 == 0; uVar32 = uVar32 - 1) {
        }
      }
      uVar32 = (uVar32 ^ 0xffe0) + 0x2c;
    }
  }
  uVar5 = (ushort)uVar32;
  uVar16 = (uVar5 & 7) + ((ushort)uVar14 & 7) * 8;
  if (((uVar27 == 0) && ((ushort)uVar14 < 8)) && (uVar5 < 0x10)) {
    if (7 < uVar5) {
      uVar16 = uVar16 | 0x40;
    }
  }
  else {
    uVar16 = uVar16 | *(ushort *)
                       (CombineLengthCodes_cells +
                       (ulong)((int)((uVar14 & 0xffff) >> 3) * 3 + ((uVar32 & 0xffff) >> 3)) * 2);
  }
  local_e0->cmd_prefix_ = uVar16;
  *num_literals = *num_literals + local_138;
  local_f8 = uVar10 + lVar25 + local_100 * 2;
  position = local_100 + uVar10;
  uVar10 = uVar10 + 2;
  uVar14 = sVar28;
  if (position < sVar28) {
    uVar14 = position;
  }
  if (uVar10 < uVar14) {
    do {
      uVar32 = (uint)(*(int *)(ringbuffer + (uVar10 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
      uVar27 = hasher->num_[uVar32];
      *(int *)((long)hasher->buckets_ + (ulong)(uVar32 * 0x400 + (uint)(byte)uVar27 * 4)) =
           (int)uVar10;
      hasher->num_[uVar32] = uVar27 + 1;
      uVar10 = uVar10 + 1;
    } while (uVar14 != uVar10);
  }
  local_138 = 0;
  local_e0 = local_e0 + 1;
LAB_0010979e:
  sVar20 = position;
  if (uVar1 <= position + 4) goto LAB_001097ff;
  goto LAB_001086d7;
code_r0x00108d04:
  uVar31 = uVar31 + 1;
  lVar13 = lVar13 + -8;
  if (uVar15 >> 3 == uVar31) goto code_r0x00108d12;
  goto LAB_00108cf1;
code_r0x00108d12:
  uVar31 = -lVar13;
  piVar12 = (int *)((long)piVar2 - lVar13);
LAB_00108d9e:
  for (; (uVar26 != 0 && (ringbuffer[uVar31 + uVar35] == (uint8_t)*piVar12)); uVar31 = uVar31 + 1) {
    uVar26 = uVar26 - 1;
    piVar12 = (int *)((long)piVar12 + 1);
  }
LAB_00108d43:
  if (3 < uVar31) {
    iVar6 = 0x1f;
    if ((uint)uVar19 != 0) {
      for (; (uint)uVar19 >> iVar6 == 0; iVar6 = iVar6 + -1) {
      }
    }
    uVar35 = (ulong)(iVar6 * -0x78 + 0x1e00) + uVar31 * 0x21c;
    if (uVar30 < uVar35) {
      bVar40 = true;
      uVar10 = uVar31;
      uVar30 = uVar35;
      local_130 = uVar31;
      local_f8 = uVar19;
    }
  }
LAB_00108d83:
  if (uVar38 <= uVar18) goto LAB_00108dd7;
  goto LAB_00108c8e;
code_r0x00108ef1:
  uVar30 = uVar30 + 1;
  lVar11 = lVar11 + -8;
  if ((uVar5 & 0x1f) >> 3 == uVar30) goto code_r0x00108efd;
  goto LAB_00108ede;
code_r0x00108efd:
  pcVar36 = pcVar36 + -lVar11;
LAB_00108f9f:
  uVar30 = (ulong)uVar5 & 7;
  local_130 = uVar39;
  if ((uVar5 & 7) != 0) {
    uVar19 = uVar39 | uVar30;
    do {
      local_130 = uVar39;
      if (*(char *)((long)piVar2 + uVar39) != *pcVar36) break;
      pcVar36 = pcVar36 + 1;
      uVar39 = uVar39 + 1;
      uVar30 = uVar30 - 1;
      local_130 = uVar19;
    } while (uVar30 != 0);
  }
LAB_00108f30:
  if ((local_130 != 0) && (uVar38 < local_130 + 10)) {
    uVar39 = (ulong)(uVar5 >> 5) + uVar22 + 1 +
             ((ulong)""[uVar38 - local_130] << ((&kBrotliDictionarySizeBitsByLength)[uVar38] & 0x3f)
             );
    iVar6 = 0x1f;
    if ((uint)uVar39 != 0) {
      for (; (uint)uVar39 >> iVar6 == 0; iVar6 = iVar6 + -1) {
      }
    }
    uVar30 = (local_130 * 0x21c - (ulong)(uint)(iVar6 * 0x78)) + 0x1e00;
    if (local_f8 <= uVar30) {
      local_d0 = uVar38 ^ local_130;
      local_a8 = local_a8 + 1;
      (hasher->dict_search_stats_).num_matches = local_a8;
      uVar33 = uVar33 + 1;
      bVar7 = !bVar40;
      bVar40 = false;
      local_a0 = uVar39;
      local_f8 = uVar30;
      local_108 = local_130;
      bVar8 = bVar40;
      if (bVar7) goto LAB_00109056;
      goto LAB_00108e77;
    }
  }
LAB_00108f85:
  uVar33 = uVar33 + 1;
  bVar7 = !bVar40;
  bVar40 = false;
  if (bVar7) {
    local_130 = local_108;
    uVar30 = local_f8;
    uVar39 = local_a0;
    if (bVar8) goto LAB_00109431;
    goto LAB_00109056;
  }
  goto LAB_00108e77;
}

Assistant:

static BROTLI_NOINLINE void FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, Hasher* hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 400;

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_x_code = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    if (FN(FindLongestMatch)(hasher, ringbuffer, ringbuffer_mask, dist_cache,
                             position, max_length, max_distance, &sr)) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 700;
        BROTLI_BOOL is_match_found;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_x_code = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        is_match_found = FN(FindLongestMatch)(hasher, ringbuffer,
            ringbuffer_mask, dist_cache, position + 1, max_length, max_distance,
            &sr2);
        if (is_match_found && sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance, dist_cache);
        if (sr.distance <= max_distance && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
        }
        InitCommand(commands++, insert_length, sr.len, sr.len ^ sr.len_x_code,
            distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them. */
      FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, position + 2,
                     BROTLI_MIN(size_t, position + sr.len, store_end));
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}